

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O1

bool __thiscall cmInstallCommandArguments::CheckPermissions(cmInstallCommandArguments *this)

{
  string *permissions;
  string *psVar1;
  bool bVar2;
  string *onePermission;
  long lVar3;
  string *psVar4;
  
  permissions = &this->PermissionsString;
  (this->PermissionsString)._M_string_length = 0;
  *(this->PermissionsString)._M_dataplus._M_p = '\0';
  onePermission =
       (this->Permissions).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->Permissions).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)onePermission >> 7;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = CheckPermissions(onePermission,permissions);
      psVar4 = onePermission;
      if (!bVar2) goto LAB_0029a497;
      bVar2 = CheckPermissions(onePermission + 1,permissions);
      psVar4 = onePermission + 1;
      if (!bVar2) goto LAB_0029a497;
      bVar2 = CheckPermissions(onePermission + 2,permissions);
      psVar4 = onePermission + 2;
      if (!bVar2) goto LAB_0029a497;
      bVar2 = CheckPermissions(onePermission + 3,permissions);
      psVar4 = onePermission + 3;
      if (!bVar2) goto LAB_0029a497;
      onePermission = onePermission + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)psVar1 - (long)onePermission >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      psVar4 = psVar1;
      if ((lVar3 != 3) ||
         (bVar2 = CheckPermissions(onePermission,permissions), psVar4 = onePermission, !bVar2))
      goto LAB_0029a497;
      onePermission = onePermission + 1;
    }
    bVar2 = CheckPermissions(onePermission,permissions);
    psVar4 = onePermission;
    if (!bVar2) goto LAB_0029a497;
    onePermission = onePermission + 1;
  }
  bVar2 = CheckPermissions(onePermission,permissions);
  psVar4 = onePermission;
  if (bVar2) {
    psVar4 = psVar1;
  }
LAB_0029a497:
  return psVar4 == psVar1;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions()
{
  this->PermissionsString.clear();
  return std::all_of(this->Permissions.begin(), this->Permissions.end(),
                     [this](std::string const& perm) -> bool {
                       return cmInstallCommandArguments::CheckPermissions(
                         perm, this->PermissionsString);
                     });
}